

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  sqlite3_xauth p_Var1;
  char *zOld;
  Select *p;
  Index *pIVar2;
  FKey *pFVar3;
  char *zLeft;
  TriggerStep *pTVar4;
  int iVar5;
  int iVar6;
  uchar *zSql;
  uchar *zDatabase;
  uchar *puVar7;
  i64 iVar8;
  uchar *zNew;
  i64 iVar9;
  i64 iVar10;
  Table *pTVar11;
  Table *pTVar12;
  sColMap *pPtr;
  TriggerStep **ppTVar13;
  uint uVar14;
  long lVar15;
  Index **ppIVar16;
  FKey **ppFVar17;
  RenameCtx sCtx;
  Walker local_1f8;
  Parse sParse;
  
  db = context->pOut->db;
  zSql = sqlite3_value_text(*argv);
  zDatabase = sqlite3_value_text(argv[3]);
  puVar7 = sqlite3_value_text(argv[4]);
  iVar8 = sqlite3VdbeIntValue(argv[5]);
  zNew = sqlite3_value_text(argv[6]);
  iVar9 = sqlite3VdbeIntValue(argv[7]);
  iVar10 = sqlite3VdbeIntValue(argv[8]);
  uVar14 = (uint)iVar8;
  if (((int)uVar14 < 0 || zNew == (uchar *)0x0) || (puVar7 == (uchar *)0x0 || zSql == (uchar *)0x0))
  {
    return;
  }
  p_Var1 = db->xAuth;
  sqlite3BtreeEnterAll(db);
  pTVar11 = sqlite3FindTable(db,(char *)puVar7,(char *)zDatabase);
  if ((pTVar11 == (Table *)0x0) || ((int)pTVar11->nCol <= (int)uVar14)) {
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTVar11->aCol[uVar14 & 0x7fffffff].zName;
  sCtx.pTab = (Table *)0x0;
  sCtx.zOld = (char *)0x0;
  sCtx.pList = (RenameToken *)0x0;
  sCtx.iCol = 0xffffffff;
  if (uVar14 != (int)pTVar11->iPKey) {
    sCtx.iCol = uVar14;
  }
  sCtx.nList = 0;
  db->xAuth = (sqlite3_xauth)0x0;
  iVar5 = renameParseSql(&sParse,(char *)zDatabase,0,db,(char *)zSql,(int)iVar10);
  pTVar12 = sParse.pNewTable;
  local_1f8.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_1f8.walkerDepth = 0;
  local_1f8.eCode = '\0';
  local_1f8._37_3_ = 0;
  local_1f8.xExprCallback = renameColumnExprCb;
  local_1f8.xSelectCallback = renameColumnSelectCb;
  sCtx.pTab = pTVar11;
  local_1f8.pParse = &sParse;
  local_1f8.u.pNC = (NameContext *)&sCtx;
  if (iVar5 == 0) {
    if (sParse.pNewTable == (Table *)0x0) {
      if (sParse.pNewIndex == (Index *)0x0) {
        puVar7 = (uchar *)0x0;
        if ((int)iVar10 == 0) {
          puVar7 = zDatabase;
        }
        iVar5 = renameResolveTrigger(&sParse,(char *)puVar7);
        if (iVar5 != 0) goto LAB_0017e5a2;
        ppTVar13 = &(sParse.pNewTrigger)->step_list;
        while (pTVar4 = *ppTVar13, pTVar4 != (TriggerStep *)0x0) {
          if ((pTVar4->zTarget != (char *)0x0) &&
             (pTVar12 = sqlite3LocateTable(&sParse,0,pTVar4->zTarget,(char *)zDatabase),
             pTVar12 == pTVar11)) {
            if (pTVar4->pUpsert != (Upsert *)0x0) {
              renameColumnElistNames(&sParse,&sCtx,pTVar4->pUpsert->pUpsertSet,zOld);
            }
            renameColumnIdlistNames(&sParse,&sCtx,pTVar4->pIdList,zOld);
            renameColumnElistNames(&sParse,&sCtx,pTVar4->pExprList,zOld);
          }
          ppTVar13 = &pTVar4->pNext;
        }
        if (sParse.pTriggerTab == pTVar11) {
          renameColumnIdlistNames(&sParse,&sCtx,(sParse.pNewTrigger)->pColumns,zOld);
        }
        renameWalkTrigger(&local_1f8,sParse.pNewTrigger);
      }
      else {
        sqlite3WalkExprList(&local_1f8,(sParse.pNewIndex)->aColExpr);
        sqlite3WalkExpr(&local_1f8,(sParse.pNewIndex)->pPartIdxWhere);
      }
    }
    else {
      p = (sParse.pNewTable)->pSelect;
      if (p == (Select *)0x0) {
        iVar5 = sqlite3_stricmp((char *)puVar7,(sParse.pNewTable)->zName);
        sCtx.pTab = pTVar12;
        if (iVar5 == 0) {
          renameTokenFind(&sParse,&sCtx,pTVar12->aCol[uVar14 & 0x7fffffff].zName);
          if (sCtx.iCol < 0) {
            renameTokenFind(&sParse,&sCtx,&(sParse.pNewTable)->iPKey);
          }
          sqlite3WalkExprList(&local_1f8,(sParse.pNewTable)->pCheck);
          ppIVar16 = &(sParse.pNewTable)->pIndex;
          while (pIVar2 = *ppIVar16, pTVar12 = sParse.pNewTable, pIVar2 != (Index *)0x0) {
            sqlite3WalkExprList(&local_1f8,pIVar2->aColExpr);
            ppIVar16 = &pIVar2->pNext;
          }
        }
        ppFVar17 = &pTVar12->pFKey;
        while (pFVar3 = *ppFVar17, pFVar3 != (FKey *)0x0) {
          pPtr = pFVar3->aCol;
          for (lVar15 = 0; lVar15 < pFVar3->nCol; lVar15 = lVar15 + 1) {
            if ((iVar5 == 0) && (pPtr->iFrom == uVar14)) {
              renameTokenFind(&sParse,&sCtx,pPtr);
            }
            iVar6 = sqlite3_stricmp(pFVar3->zTo,(char *)puVar7);
            if (iVar6 == 0) {
              zLeft = pPtr->zCol;
              iVar6 = sqlite3_stricmp(zLeft,zOld);
              if (iVar6 == 0) {
                renameTokenFind(&sParse,&sCtx,zLeft);
              }
            }
            pPtr = pPtr + 1;
          }
          ppFVar17 = &pFVar3->pNextFrom;
        }
      }
      else {
        sParse.rc = 0;
        sqlite3SelectPrep(&sParse,p,(NameContext *)0x0);
        iVar5 = sParse.rc;
        if (db->mallocFailed != '\0') {
          iVar5 = 7;
        }
        if (iVar5 != 0) goto LAB_0017e5a2;
        sqlite3WalkSelect(&local_1f8,p);
      }
    }
    iVar5 = renameEditSql(context,&sCtx,(char *)zSql,(char *)zNew,(int)iVar9);
    if (iVar5 == 0) goto LAB_0017e5d8;
  }
LAB_0017e5a2:
  if (sParse.zErrMsg == (char *)0x0) {
    sqlite3_result_error_code(context,iVar5);
  }
  else {
    renameColumnParseError(context,0,argv[1],argv[2],&sParse);
  }
LAB_0017e5d8:
  renameParseCleanup(&sParse);
  renameTokenFree(db,sCtx.pList);
  db->xAuth = p_Var1;
  sqlite3BtreeLeaveAll(db);
  return;
}

Assistant:

static void renameColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  RenameCtx sCtx;
  const char *zSql = (const char*)sqlite3_value_text(argv[0]);
  const char *zDb = (const char*)sqlite3_value_text(argv[3]);
  const char *zTable = (const char*)sqlite3_value_text(argv[4]);
  int iCol = sqlite3_value_int(argv[5]);
  const char *zNew = (const char*)sqlite3_value_text(argv[6]);
  int bQuote = sqlite3_value_int(argv[7]);
  int bTemp = sqlite3_value_int(argv[8]);
  const char *zOld;
  int rc;
  Parse sParse;
  Walker sWalker;
  Index *pIdx;
  int i;
  Table *pTab;
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zSql==0 ) return;
  if( zTable==0 ) return;
  if( zNew==0 ) return;
  if( iCol<0 ) return;
  sqlite3BtreeEnterAll(db);
  pTab = sqlite3FindTable(db, zTable, zDb);
  if( pTab==0 || iCol>=pTab->nCol ){
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTab->aCol[iCol].zName;
  memset(&sCtx, 0, sizeof(sCtx));
  sCtx.iCol = ((iCol==pTab->iPKey) ? -1 : iCol);

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = 0;
#endif
  rc = renameParseSql(&sParse, zDb, 0, db, zSql, bTemp);

  /* Find tokens that need to be replaced. */
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = &sParse;
  sWalker.xExprCallback = renameColumnExprCb;
  sWalker.xSelectCallback = renameColumnSelectCb;
  sWalker.u.pRename = &sCtx;

  sCtx.pTab = pTab;
  if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
  if( sParse.pNewTable ){
    Select *pSelect = sParse.pNewTable->pSelect;
    if( pSelect ){
      sParse.rc = SQLITE_OK;
      sqlite3SelectPrep(&sParse, sParse.pNewTable->pSelect, 0);
      rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
      if( rc==SQLITE_OK ){
        sqlite3WalkSelect(&sWalker, pSelect);
      }
      if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
    }else{
      /* A regular table */
      int bFKOnly = sqlite3_stricmp(zTable, sParse.pNewTable->zName);
      FKey *pFKey;
      assert( sParse.pNewTable->pSelect==0 );
      sCtx.pTab = sParse.pNewTable;
      if( bFKOnly==0 ){
        renameTokenFind(
            &sParse, &sCtx, (void*)sParse.pNewTable->aCol[iCol].zName
        );
        if( sCtx.iCol<0 ){
          renameTokenFind(&sParse, &sCtx, (void*)&sParse.pNewTable->iPKey);
        }
        sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
        for(pIdx=sParse.pNewTable->pIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
      }

      for(pFKey=sParse.pNewTable->pFKey; pFKey; pFKey=pFKey->pNextFrom){
        for(i=0; i<pFKey->nCol; i++){
          if( bFKOnly==0 && pFKey->aCol[i].iFrom==iCol ){
            renameTokenFind(&sParse, &sCtx, (void*)&pFKey->aCol[i]);
          }
          if( 0==sqlite3_stricmp(pFKey->zTo, zTable)
           && 0==sqlite3_stricmp(pFKey->aCol[i].zCol, zOld)
          ){
            renameTokenFind(&sParse, &sCtx, (void*)pFKey->aCol[i].zCol);
          }
        }
      }
    }
  }else if( sParse.pNewIndex ){
    sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
    sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
  }else{
    /* A trigger */
    TriggerStep *pStep;
    rc = renameResolveTrigger(&sParse, (bTemp ? 0 : zDb));
    if( rc!=SQLITE_OK ) goto renameColumnFunc_done;

    for(pStep=sParse.pNewTrigger->step_list; pStep; pStep=pStep->pNext){
      if( pStep->zTarget ){ 
        Table *pTarget = sqlite3LocateTable(&sParse, 0, pStep->zTarget, zDb);
        if( pTarget==pTab ){
          if( pStep->pUpsert ){
            ExprList *pUpsertSet = pStep->pUpsert->pUpsertSet;
            renameColumnElistNames(&sParse, &sCtx, pUpsertSet, zOld);
          }
          renameColumnIdlistNames(&sParse, &sCtx, pStep->pIdList, zOld);
          renameColumnElistNames(&sParse, &sCtx, pStep->pExprList, zOld);
        }
      }
    }


    /* Find tokens to edit in UPDATE OF clause */
    if( sParse.pTriggerTab==pTab ){
      renameColumnIdlistNames(&sParse, &sCtx,sParse.pNewTrigger->pColumns,zOld);
    }

    /* Find tokens to edit in various expressions and selects */
    renameWalkTrigger(&sWalker, sParse.pNewTrigger);
  }

  assert( rc==SQLITE_OK );
  rc = renameEditSql(context, &sCtx, zSql, zNew, bQuote);

renameColumnFunc_done:
  if( rc!=SQLITE_OK ){
    if( sParse.zErrMsg ){
      renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
    }else{
      sqlite3_result_error_code(context, rc);
    }
  }

  renameParseCleanup(&sParse);
  renameTokenFree(db, sCtx.pList);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  sqlite3BtreeLeaveAll(db);
}